

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_iTXt(ucvector *out,uint compressed,char *keyword,char *langtag,char *transkey,
                  char *textstring,LodePNGCompressSettings *zlibsettings)

{
  ucvector *out_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R8;
  char *in_R9;
  ucvector compressed_data;
  size_t textsize;
  size_t i;
  ucvector data;
  uint error;
  LodePNGCompressSettings *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  uchar *in_stack_ffffffffffffff88;
  size_t *in_stack_ffffffffffffff90;
  uchar *local_60;
  ucvector local_58;
  uint local_3c;
  char *local_38;
  long local_30;
  long local_28;
  long local_20;
  int local_14;
  uint local_4;
  
  local_3c = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  out_00 = (ucvector *)lodepng_strlen(in_R9);
  ucvector_init(&local_58);
  for (local_60 = (uchar *)0x0; *(char *)(local_20 + (long)local_60) != '\0';
      local_60 = (uchar *)((long)local_60 + 1)) {
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
  }
  if ((local_60 == (uchar *)0x0) || (0x4f < local_60)) {
    local_4 = 0x59;
  }
  else {
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    for (local_60 = (uchar *)0x0; *(char *)(local_28 + (long)local_60) != '\0';
        local_60 = (uchar *)((long)local_60 + 1)) {
      ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    }
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    for (local_60 = (uchar *)0x0; *(char *)(local_30 + (long)local_60) != '\0';
        local_60 = (uchar *)((long)local_60 + 1)) {
      ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    }
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
    if (local_14 == 0) {
      for (local_60 = (uchar *)0x0; local_38[(long)local_60] != '\0';
          local_60 = (uchar *)((long)local_60 + 1)) {
        ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
      }
    }
    else {
      ucvector_init((ucvector *)&stack0xffffffffffffff80);
      local_3c = zlib_compress(&out_00->data,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (local_3c == 0) {
        for (local_60 = (uchar *)0x0; local_60 != in_stack_ffffffffffffff88; local_60 = local_60 + 1
            ) {
          ucvector_push_back((ucvector *)in_stack_ffffffffffffff78,'\0');
        }
      }
      ucvector_cleanup((void *)0x132ca5);
    }
    if (local_3c == 0) {
      local_3c = addChunk(out_00,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          (size_t)in_stack_ffffffffffffff80);
    }
    ucvector_cleanup((void *)0x132d1d);
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

static unsigned addChunk_iTXt(ucvector* out, unsigned compressed, const char* keyword, const char* langtag,
                              const char* transkey, const char* textstring, LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  ucvector data;
  size_t i, textsize = lodepng_strlen(textstring);

  ucvector_init(&data);

  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*null termination char*/
  ucvector_push_back(&data, compressed ? 1 : 0); /*compression flag*/
  ucvector_push_back(&data, 0); /*compression method*/
  for(i = 0; langtag[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)langtag[i]);
  ucvector_push_back(&data, 0); /*null termination char*/
  for(i = 0; transkey[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)transkey[i]);
  ucvector_push_back(&data, 0); /*null termination char*/

  if(compressed) {
    ucvector compressed_data;
    ucvector_init(&compressed_data);
    error = zlib_compress(&compressed_data.data, &compressed_data.size,
                          (const unsigned char*)textstring, textsize, zlibsettings);
    if(!error) {
      for(i = 0; i != compressed_data.size; ++i) ucvector_push_back(&data, compressed_data.data[i]);
    }
    ucvector_cleanup(&compressed_data);
  } else /*not compressed*/ {
    for(i = 0; textstring[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)textstring[i]);
  }

  if(!error) error = addChunk(out, "iTXt", data.data, data.size);
  ucvector_cleanup(&data);
  return error;
}